

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

ostream * operator<<(ostream *os,vector<Cards,_std::allocator<Cards>_> *v)

{
  pointer pCVar1;
  int i;
  ulong uVar2;
  long lVar3;
  
  std::operator<<(os,"[");
  lVar3 = 0;
  for (uVar2 = 0;
      pCVar1 = (v->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(v->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pCVar1) / 0x70);
      uVar2 = uVar2 + 1) {
    operator<<(os,(Cards *)((long)&pCVar1->id + lVar3));
    if (uVar2 != ((long)(v->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(v->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
                       super__Vector_impl_data._M_start) / 0x70 - 1U) {
      std::operator<<(os,", ");
    }
    lVar3 = lVar3 + 0x70;
  }
  std::operator<<(os,"]\n");
  return os;
}

Assistant:

ostream& operator<<(ostream& os, vector<Cards> v)
{
    os << "[";
    for (int i = 0; i < v.size(); ++i) {
        os << v[i];
        if (i != v.size() - 1)
            os << ", ";
    }
    os << "]\n";
    return os;
}